

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

string * __thiscall
google::protobuf::Reflection::GetRepeatedStringReference
          (Reflection *this,Message *message,FieldDescriptor *field,int index,string *scratch)

{
  byte bVar1;
  CppStringType CVar2;
  uint32_t uVar3;
  RepeatedField<absl::lts_20250127::Cord> *this_00;
  const_reference src;
  string *psVar4;
  RepeatedPtrFieldBase *this_01;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar5;
  Nonnull<const_char_*> pcVar6;
  bool v1;
  char *description;
  Descriptor *pDVar7;
  Metadata MVar8;
  
  MVar8 = Message::GetMetadata(message);
  if (MVar8.reflection != this) {
    pDVar7 = this->descriptor_;
    MVar8 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar7,MVar8.descriptor,field,"GetRepeatedStringReference");
  }
  pDVar7 = this->descriptor_;
  if (field->containing_type_ == pDVar7) {
    bVar1 = field->field_0x1;
    v1 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == v1) {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (v1,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar6 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) != 0) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (this->descriptor_,field,"GetRepeatedStringReference",CPPTYPE_STRING);
        }
        if ((field->field_0x1 & 8) == 0) {
          CVar2 = FieldDescriptor::cpp_string_type(field);
          if ((CVar2 != kView) && (CVar2 != kString)) {
            if (CVar2 == kCord) {
              this_00 = GetRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                                  (this,message,field);
              src = RepeatedField<absl::lts_20250127::Cord>::Get(this_00,index);
              absl::lts_20250127::CopyCordToString(src,scratch);
              return scratch;
            }
            GetRepeatedStringReference();
          }
          this_01 = &GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                               (this,message,field)->super_RepeatedPtrFieldBase;
          pVVar5 = protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                             (this_01,index);
          return pVVar5;
        }
        uVar3 = protobuf::internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        psVar4 = protobuf::internal::ExtensionSet::GetRepeatedString_abi_cxx11_
                           ((ExtensionSet *)
                            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                            field->number_,index);
        return psVar4;
      }
    }
    else {
      GetRepeatedStringReference();
    }
    pDVar7 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar7,field,"GetRepeatedStringReference",description);
}

Assistant:

const std::string& Reflection::GetRepeatedStringReference(
    const Message& message, const FieldDescriptor* field, int index,
    std::string* scratch) const {
  (void)scratch;  // Parameter is used by Google-internal code.
  USAGE_CHECK_ALL(GetRepeatedStringReference, REPEATED, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRepeatedString(field->number(), index);
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        absl::CopyCordToString(
            GetRepeatedField<absl::Cord>(message, field, index), scratch);
        return *scratch;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        return GetRepeatedPtrField<std::string>(message, field, index);
    }
    internal::Unreachable();
  }
}